

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_b3fcdf::X509Test_DirHashThreads_Test::TestBody
          (X509Test_DirHashThreads_Test *this)

{
  undefined1 auVar1 [8];
  bool bVar2;
  int iVar3;
  EVP_MD *pEVar4;
  undefined1 auVar5 [8];
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar6;
  pointer pcVar7;
  char *pcVar8;
  char *in_R9;
  pointer *__ptr;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var9;
  long lVar10;
  UniquePtr<X509> old_leaf1;
  UniquePtr<X509> old_leaf2;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  string old_ca1;
  anon_class_8_1_a8a4e801 verify;
  string old_ca2;
  UniquePtr<EVP_PKEY> key;
  UniquePtr<X509_STORE> store;
  UniquePtr<X509> leaf2;
  UniquePtr<X509> leaf1;
  string ca1;
  string ca2;
  anon_class_16_2_441bd9f7 add_crl;
  anon_class_8_1_ba1d59bf issue_cert;
  anon_class_16_2_441bd9f7 add_root;
  TemporaryHashDir dir;
  undefined1 local_208 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_200;
  UniquePtr<X509> local_1f8;
  undefined1 local_1f0 [8];
  undefined1 local_1e8 [8];
  undefined1 auStack_1e0 [8];
  undefined1 local_1d8 [24];
  undefined1 local_1c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  undefined1 local_1a0 [8];
  AssertHelper local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_190;
  _Alloc_hider local_188;
  undefined1 local_178 [8];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  NAME_CONSTRAINTS *local_120 [2];
  anon_class_16_2_441bd9f7 local_110;
  undefined1 local_100 [16];
  undefined1 local_f0 [8];
  undefined1 local_e8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Rb_tree_node_base local_b8;
  size_t local_98;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  local_90;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  local_60;
  
  bVar2 = bssl::SkipTempFileTests();
  if (bVar2) {
    testing::Message::Message((Message *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_150,kSkip,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x20ad,"");
    testing::internal::AssertHelper::operator=((AssertHelper *)local_150,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_150);
    if ((long *)CONCAT44(local_e8._4_4_,local_e8._0_4_) == (long *)0x0) {
      return;
    }
    (**(code **)(*(long *)CONCAT44(local_e8._4_4_,local_e8._0_4_) + 8))();
    return;
  }
  PrivateKeyFromPEM((anon_unknown_dwarf_b3fcdf *)local_178,
                    "\n-----BEGIN PRIVATE KEY-----\nMIGHAgEAMBMGByqGSM49AgEGCCqGSM49AwEHBG0wawIBAQQgBw8IcnrUoEqc3VnJ\nTYlodwi1b8ldMHcO6NHJzgqLtGqhRANCAATmK2niv2Wfl74vHg2UikzVl2u3qR4N\nRvvdqakendy6WgHn1peoChj5w8SjHlbifINI2xYaHPUdfvGULUvPciLB\n-----END PRIVATE KEY-----\n"
                   );
  local_150[0] = (_Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>)local_178 !=
                 (evp_pkey_st *)0x0;
  local_148 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((_Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>)local_178 == (evp_pkey_st *)0x0) {
    testing::Message::Message((Message *)&local_130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e8,(internal *)local_150,(AssertionResult *)0x5e57b2,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x20b1,(char *)CONCAT44(local_e8._4_4_,local_e8._0_4_));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1c0,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1c0);
    if ((undefined1 *)CONCAT44(local_e8._4_4_,local_e8._0_4_) != local_e8 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_e8._4_4_,local_e8._0_4_),local_e8._16_8_ + 1);
    }
    if (local_130._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)(*(NAME_CONSTRAINTS **)local_130._M_head_impl)->excludedSubtrees)();
    }
    if (local_148 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_148,local_148);
    }
    goto LAB_00400101;
  }
  local_e8._0_4_ = 1;
  local_e8._8_8_ = &local_d0;
  local_e8._16_8_ = 0;
  local_d0._M_local_buf[0] = '\0';
  local_b8._M_left = &local_b8;
  local_b8._M_color = _S_red;
  local_b8._M_parent = (_Base_ptr)0x0;
  local_98 = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8._M_right = local_b8._M_left;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar2 = bssl::TemporaryDirectory::Init((TemporaryDirectory *)(local_e8 + 8));
  local_130._M_head_impl._0_1_ = bVar2;
  local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    local_110.dir = (TemporaryHashDir *)local_e8;
    local_150 = (undefined1  [8])&local_140;
    local_110.key = (UniquePtr<EVP_PKEY> *)local_178;
    local_100._0_8_ = (anon_unknown_dwarf_b3fcdf *)local_178;
    local_100._8_8_ = (anon_unknown_dwarf_b3fcdf *)local_178;
    local_f0 = (undefined1  [8])local_110.dir;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"Test CA 1191514847","");
    local_130._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Test CA 1570301806","");
    MakeTestCert((anon_unknown_dwarf_b3fcdf *)local_1c0,(char *)local_150,(char *)local_150,
                 (EVP_PKEY *)local_178,true);
    auVar1 = local_178;
    auVar5 = local_1c0;
    if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)local_1c0 ==
        (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
LAB_003ffa44:
      bVar2 = false;
    }
    else {
      pEVar4 = EVP_sha256();
      iVar3 = X509_sign((X509 *)auVar5,(EVP_PKEY *)auVar1,pEVar4);
      if (iVar3 == 0) goto LAB_003ffa44;
      bVar2 = TemporaryHashDir::AddCert((TemporaryHashDir *)local_e8,(X509 *)local_1c0,kNewHash);
    }
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)local_1c0);
    local_198.data_._0_1_ = bVar2;
    local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar2 == false) {
      testing::Message::Message((Message *)local_1e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1c0,(internal *)&local_198,
                 (AssertionResult *)"add_root(ca1, kNewHash)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_208,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x20d6,(char *)local_1c0);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_208,(Message *)local_1e8);
LAB_00400060:
      pdVar6 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_190;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_208);
      if (local_1c0 != (undefined1  [8])&local_1b0) {
        operator_delete((void *)local_1c0,local_1b0._M_allocated_capacity + 1);
      }
      if (local_1e8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_1e8 + 8))();
      }
      local_1b8 = local_190;
      if (local_190 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
LAB_004000a0:
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()(pdVar6,local_1b8);
      }
    }
    else {
      MakeTestCert((anon_unknown_dwarf_b3fcdf *)local_1c0,(char *)local_130._M_head_impl,
                   (char *)local_130._M_head_impl,(EVP_PKEY *)local_178,true);
      auVar1 = local_178;
      auVar5 = local_1c0;
      if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)local_1c0 ==
          (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
LAB_003ffb31:
        bVar2 = false;
      }
      else {
        pEVar4 = EVP_sha256();
        iVar3 = X509_sign((X509 *)auVar5,(EVP_PKEY *)auVar1,pEVar4);
        if (iVar3 == 0) goto LAB_003ffb31;
        bVar2 = TemporaryHashDir::AddCert((TemporaryHashDir *)local_e8,(X509 *)local_1c0,kNewHash);
      }
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)local_1c0);
      local_198.data_._0_1_ = bVar2;
      local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar2 == false) {
        testing::Message::Message((Message *)local_1e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1c0,(internal *)&local_198,
                   (AssertionResult *)"add_root(ca2, kNewHash)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_208,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x20d7,(char *)local_1c0);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_208,(Message *)local_1e8);
        goto LAB_00400060;
      }
      MakeTestCRL((anon_unknown_dwarf_b3fcdf *)local_1c0,(char *)local_150,-2,1);
      auVar1 = local_178;
      auVar5 = local_1c0;
      if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)local_1c0 ==
          (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
LAB_003ffc17:
        bVar2 = false;
      }
      else {
        pEVar4 = EVP_sha256();
        iVar3 = X509_CRL_sign((X509_CRL *)auVar5,(EVP_PKEY *)auVar1,pEVar4);
        if (iVar3 == 0) goto LAB_003ffc17;
        bVar2 = TemporaryHashDir::AddCRL
                          ((TemporaryHashDir *)local_e8,(X509_CRL *)local_1c0,kNewHash);
      }
      std::unique_ptr<X509_crl_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<X509_crl_st,_bssl::internal::Deleter> *)local_1c0);
      local_198.data_._0_1_ = bVar2;
      local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar2 == false) {
        testing::Message::Message((Message *)local_1e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1c0,(internal *)&local_198,
                   (AssertionResult *)"add_crl(ca1, -2, kNewHash)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_208,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x20d8,(char *)local_1c0);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_208,(Message *)local_1e8);
        goto LAB_00400060;
      }
      MakeTestCRL((anon_unknown_dwarf_b3fcdf *)local_1c0,(char *)local_130._M_head_impl,-1,1);
      auVar1 = local_178;
      auVar5 = local_1c0;
      if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)local_1c0 ==
          (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
LAB_003ffcfd:
        bVar2 = false;
      }
      else {
        pEVar4 = EVP_sha256();
        iVar3 = X509_CRL_sign((X509_CRL *)auVar5,(EVP_PKEY *)auVar1,pEVar4);
        if (iVar3 == 0) goto LAB_003ffcfd;
        bVar2 = TemporaryHashDir::AddCRL
                          ((TemporaryHashDir *)local_e8,(X509_CRL *)local_1c0,kNewHash);
      }
      std::unique_ptr<X509_crl_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<X509_crl_st,_bssl::internal::Deleter> *)local_1c0);
      local_198.data_._0_1_ = bVar2;
      local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar2 == false) {
        testing::Message::Message((Message *)local_1e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1c0,(internal *)&local_198,
                   (AssertionResult *)"add_crl(ca2, -1, kNewHash)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_208,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x20d9,(char *)local_1c0);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_208,(Message *)local_1e8);
        goto LAB_00400060;
      }
      MakeTestCRL((anon_unknown_dwarf_b3fcdf *)local_1c0,(char *)local_130._M_head_impl,-2,1);
      auVar1 = local_178;
      auVar5 = local_1c0;
      if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)local_1c0 ==
          (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
LAB_003ffde3:
        bVar2 = false;
      }
      else {
        pEVar4 = EVP_sha256();
        iVar3 = X509_CRL_sign((X509_CRL *)auVar5,(EVP_PKEY *)auVar1,pEVar4);
        if (iVar3 == 0) goto LAB_003ffde3;
        bVar2 = TemporaryHashDir::AddCRL
                          ((TemporaryHashDir *)local_e8,(X509_CRL *)local_1c0,kNewHash);
      }
      std::unique_ptr<X509_crl_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<X509_crl_st,_bssl::internal::Deleter> *)local_1c0);
      local_198.data_._0_1_ = bVar2;
      local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar2 == false) {
        testing::Message::Message((Message *)local_1e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1c0,(internal *)&local_198,
                   (AssertionResult *)"add_crl(ca2, -2, kNewHash)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_208,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x20da,(char *)local_1c0);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_208,(Message *)local_1e8);
        goto LAB_00400060;
      }
      MakeTestCRL((anon_unknown_dwarf_b3fcdf *)local_1c0,(char *)local_150,-1,1);
      auVar1 = local_178;
      auVar5 = local_1c0;
      if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)local_1c0 ==
          (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
LAB_003ffec9:
        bVar2 = false;
      }
      else {
        pEVar4 = EVP_sha256();
        iVar3 = X509_CRL_sign((X509_CRL *)auVar5,(EVP_PKEY *)auVar1,pEVar4);
        if (iVar3 == 0) goto LAB_003ffec9;
        bVar2 = TemporaryHashDir::AddCRL
                          ((TemporaryHashDir *)local_e8,(X509_CRL *)local_1c0,kNewHash);
      }
      std::unique_ptr<X509_crl_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<X509_crl_st,_bssl::internal::Deleter> *)local_1c0);
      local_198.data_._0_1_ = bVar2;
      local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar2 == false) {
        testing::Message::Message((Message *)local_1e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1c0,(internal *)&local_198,
                   (AssertionResult *)"add_crl(ca1, -1, kNewHash)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_208,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x20db,(char *)local_1c0);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_208,(Message *)local_1e8);
        goto LAB_00400060;
      }
      local_198.data_ = (AssertHelperData *)local_90._M_impl.super__Rb_tree_header._M_node_count;
      local_1e8._0_4_ = 1;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                ((internal *)local_1c0,"dir.num_cert_hashes()","1u",(unsigned_long *)&local_198,
                 (uint *)local_1e8);
      if ((anon_unknown_dwarf_b3fcdf)local_1c0[0] == (anon_unknown_dwarf_b3fcdf)0x0) {
        testing::Message::Message((Message *)&local_198);
        if (local_1b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = (local_1b8->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_1e8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x20dd,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_1e8,(Message *)&local_198);
LAB_00400682:
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1e8);
        if (local_198.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(pointer *)local_198.data_ + 8))();
        }
        if (local_1b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        goto LAB_004000a5;
        pdVar6 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1b8;
        goto LAB_004000a0;
      }
      if (local_1b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1b8,local_1b8);
      }
      local_198.data_ = (AssertHelperData *)local_60._M_impl.super__Rb_tree_header._M_node_count;
      local_1e8._0_4_ = 1;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                ((internal *)local_1c0,"dir.num_crl_hashes()","1u",(unsigned_long *)&local_198,
                 (uint *)local_1e8);
      if ((anon_unknown_dwarf_b3fcdf)local_1c0[0] == (anon_unknown_dwarf_b3fcdf)0x0) {
        testing::Message::Message((Message *)&local_198);
        if (local_1b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = (local_1b8->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_1e8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x20de,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_1e8,(Message *)&local_198);
        goto LAB_00400682;
      }
      if (local_1b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1b8,local_1b8);
      }
      MakeTestCert((anon_unknown_dwarf_b3fcdf *)local_1c0,(char *)local_150,"Leaf",
                   (EVP_PKEY *)local_178,false);
      auVar1 = local_178;
      auVar5 = local_1c0;
      if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)local_1c0 ==
          (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
LAB_0040018f:
        local_160._8_8_ = (_Head_base<0UL,_x509_st_*,_false>)0x0;
      }
      else {
        pEVar4 = EVP_sha256();
        iVar3 = X509_sign((X509 *)auVar5,(EVP_PKEY *)auVar1,pEVar4);
        if (iVar3 == 0) goto LAB_0040018f;
        local_160._8_8_ = local_1c0;
        local_1c0 = (undefined1  [8])0x0;
      }
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)local_1c0);
      local_198.data_._0_1_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_160._8_8_ !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._8_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        testing::Message::Message((Message *)local_1e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1c0,(internal *)&local_198,(AssertionResult *)0x58dfbf,"false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_208,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x20e0,(char *)local_1c0);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_208,(Message *)local_1e8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_208);
        if (local_1c0 != (undefined1  [8])&local_1b0) {
          operator_delete((void *)local_1c0,local_1b0._M_allocated_capacity + 1);
        }
        if (local_1e8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_1e8 + 8))();
        }
        if (local_190 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_190,local_190);
        }
      }
      else {
        MakeTestCert((anon_unknown_dwarf_b3fcdf *)local_1c0,(char *)local_130._M_head_impl,"Leaf",
                     (EVP_PKEY *)local_178,false);
        auVar5 = local_1c0;
        if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)local_1c0 ==
            (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
LAB_00400227:
          local_160._0_8_ = (_Head_base<0UL,_x509_st_*,_false>)0x0;
        }
        else {
          pEVar4 = EVP_sha256();
          iVar3 = X509_sign((X509 *)auVar5,(EVP_PKEY *)local_178,pEVar4);
          if (iVar3 == 0) goto LAB_00400227;
          local_160._0_8_ = local_1c0;
          local_1c0 = (undefined1  [8])0x0;
        }
        std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<x509_st,_bssl::internal::Deleter> *)local_1c0);
        local_198.data_._0_1_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_160._0_8_ !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._0_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          testing::Message::Message((Message *)local_1e8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_1c0,(internal *)&local_198,(AssertionResult *)0x58dfc9,"false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_208,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x20e2,(char *)local_1c0);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_208,(Message *)local_1e8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_208);
          if (local_1c0 != (undefined1  [8])&local_1b0) {
            operator_delete((void *)local_1c0,local_1b0._M_allocated_capacity + 1);
          }
          if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )local_1e8 !=
              (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )0x0) {
            (**(code **)(*(long *)local_1e8 + 8))();
          }
          if (local_190 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_190,local_190);
          }
        }
        else {
          local_1c0 = (undefined1  [8])&local_1b0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1c0,"Test CA 1069881739","");
          local_198.data_ = (AssertHelperData *)&local_188;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_198,"Test CA 940754110","");
          bVar2 = TestBody::anon_class_16_2_441bd9f7::operator()
                            ((anon_class_16_2_441bd9f7 *)(local_100 + 8),(string *)local_1c0,
                             kOldHash);
          local_208[0] = bVar2;
          local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (bVar2) {
            bVar2 = TestBody::anon_class_16_2_441bd9f7::operator()
                              ((anon_class_16_2_441bd9f7 *)(local_100 + 8),(string *)local_198.data_
                               ,kOldHash);
            local_208[0] = bVar2;
            local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!bVar2) {
              testing::Message::Message((Message *)&local_1f8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_1e8,(internal *)local_208,
                         (AssertionResult *)"add_root(old_ca2, kOldHash)","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_1f0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x20e8,(char *)local_1e8);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_1f0,(Message *)&local_1f8);
              goto LAB_00400a62;
            }
            bVar2 = TestBody::anon_class_16_2_441bd9f7::operator()
                              (&local_110,(string *)local_1c0,-2,kOldHash);
            local_208[0] = bVar2;
            local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!bVar2) {
              testing::Message::Message((Message *)&local_1f8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_1e8,(internal *)local_208,
                         (AssertionResult *)"add_crl(old_ca1, -2, kOldHash)","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_1f0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x20e9,(char *)local_1e8);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_1f0,(Message *)&local_1f8);
              goto LAB_00400a62;
            }
            bVar2 = TestBody::anon_class_16_2_441bd9f7::operator()
                              (&local_110,(string *)local_198.data_,-1,kOldHash);
            local_208[0] = bVar2;
            local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!bVar2) {
              testing::Message::Message((Message *)&local_1f8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_1e8,(internal *)local_208,
                         (AssertionResult *)"add_crl(old_ca2, -1, kOldHash)","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_1f0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x20ea,(char *)local_1e8);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_1f0,(Message *)&local_1f8);
              goto LAB_00400a62;
            }
            bVar2 = TestBody::anon_class_16_2_441bd9f7::operator()
                              (&local_110,(string *)local_198.data_,-2,kOldHash);
            local_208[0] = bVar2;
            local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!bVar2) {
              testing::Message::Message((Message *)&local_1f8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_1e8,(internal *)local_208,
                         (AssertionResult *)"add_crl(old_ca2, -2, kOldHash)","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_1f0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x20eb,(char *)local_1e8);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_1f0,(Message *)&local_1f8);
              goto LAB_00400a62;
            }
            bVar2 = TestBody::anon_class_16_2_441bd9f7::operator()
                              (&local_110,(string *)local_1c0,-1,kOldHash);
            local_208[0] = bVar2;
            local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!bVar2) {
              testing::Message::Message((Message *)&local_1f8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_1e8,(internal *)local_208,
                         (AssertionResult *)"add_crl(old_ca1, -1, kOldHash)","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_1f0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x20ec,(char *)local_1e8);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_1f0,(Message *)&local_1f8);
              goto LAB_00400a62;
            }
            local_208 = (undefined1  [8])local_90._M_impl.super__Rb_tree_header._M_node_count;
            local_1f8._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._0_4_ = 2;
            testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                      ((internal *)local_1e8,"dir.num_cert_hashes()","2u",(unsigned_long *)local_208
                       ,(uint *)&local_1f8);
            if (local_1e8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_208);
              if (auStack_1e0 == (undefined1  [8])0x0) {
                pcVar8 = "";
              }
              else {
                pcVar8 = *(char **)auStack_1e0;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_1f8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x20ee,pcVar8);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_1f8,(Message *)local_208);
LAB_00400c52:
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
              if (local_208 != (undefined1  [8])0x0) {
                (**(code **)(*(pointer *)local_208 + 8))();
              }
              if (auStack_1e0 == (undefined1  [8])0x0) goto LAB_00400aa9;
              pdVar6 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)auStack_1e0;
              auVar5 = auStack_1e0;
              goto LAB_00400aa4;
            }
            if (auStack_1e0 != (undefined1  [8])0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)auStack_1e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           auStack_1e0);
            }
            local_208 = (undefined1  [8])local_60._M_impl.super__Rb_tree_header._M_node_count;
            local_1f8._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._0_4_ = 2;
            testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                      ((internal *)local_1e8,"dir.num_crl_hashes()","2u",(unsigned_long *)local_208,
                       (uint *)&local_1f8);
            if (local_1e8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_208);
              if (auStack_1e0 == (undefined1  [8])0x0) {
                pcVar8 = "";
              }
              else {
                pcVar8 = *(char **)auStack_1e0;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_1f8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x20ef,pcVar8);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_1f8,(Message *)local_208);
              goto LAB_00400c52;
            }
            if (auStack_1e0 != (undefined1  [8])0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)auStack_1e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           auStack_1e0);
            }
            TestBody::anon_class_8_1_ba1d59bf::operator()
                      ((anon_class_8_1_ba1d59bf *)&local_1f8,(string *)local_100);
            bVar2 = CONCAT44(local_1f8._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                             _M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._4_4_,
                             local_1f8._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                             _M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._0_4_) == 0;
            local_208[0] = !bVar2;
            local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (bVar2) {
              testing::Message::Message((Message *)local_1f0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_1e8,(internal *)local_208,(AssertionResult *)"old_leaf1",
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_170,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x20f1,(char *)local_1e8);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_170,(Message *)local_1f0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_170);
              if (local_1e8 != (undefined1  [8])local_1d8) {
                operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
              }
              if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)local_1f0 !=
                  (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
                (**(code **)((long)*(__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>
                                     *)local_1f0 + 8))();
              }
              if (local_200 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_200,local_200);
              }
            }
            else {
              TestBody::anon_class_8_1_ba1d59bf::operator()
                        ((anon_class_8_1_ba1d59bf *)local_1f0,(string *)local_100);
              local_208[0] = (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)local_1f0 !=
                             (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
              local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)local_1f0 ==
                  (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
                testing::Message::Message((Message *)local_170);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_1e8,(internal *)local_208,(AssertionResult *)"old_leaf2",
                           "false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_1a0,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0x20f3,(char *)local_1e8);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_1a0,(Message *)local_170);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1a0);
                if (local_1e8 != (undefined1  [8])local_1d8) {
                  operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
                }
                if ((X509_STORE *)local_170._0_8_ != (X509_STORE *)0x0) {
                  (**(code **)(*(long *)local_170._0_8_ + 8))();
                }
                if (local_200 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_200,local_200);
                }
              }
              else {
                local_170._0_8_ = X509_STORE_new();
                local_208[0] = (X509_STORE *)local_170._0_8_ != (X509_STORE *)0x0;
                local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                ;
                if ((X509_STORE *)local_170._0_8_ == (X509_STORE *)0x0) {
                  testing::Message::Message((Message *)local_1a0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_1e8,(internal *)local_208,(AssertionResult *)0x52c850,
                             "false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)(local_170 + 8),kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x20f7,(char *)local_1e8);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)(local_170 + 8),(Message *)local_1a0);
LAB_00400e19:
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_170 + 8));
                  if (local_1e8 != (undefined1  [8])local_1d8) {
                    operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
                  }
                  if (local_1a0 != (undefined1  [8])0x0) {
                    (**(code **)(*(long *)local_1a0 + 8))();
                  }
                  if (local_200 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_200,local_200);
                  }
                }
                else {
                  iVar3 = X509_STORE_load_locations
                                    ((X509_STORE *)local_170._0_8_,(char *)0x0,
                                     (char *)local_e8._8_8_);
                  local_208[0] = iVar3 != 0;
                  local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0;
                  if (iVar3 == 0) {
                    testing::Message::Message((Message *)local_1a0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_1e8,(internal *)local_208,
                               (AssertionResult *)
                               "X509_STORE_load_locations(store.get(), nullptr, dir.path().c_str())"
                               ,"false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)(local_170 + 8),kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                               ,0x20f9,(char *)local_1e8);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)(local_170 + 8),(Message *)local_1a0);
                    goto LAB_00400e19;
                  }
                  local_1a0 = (undefined1  [8])local_170;
                  local_1e8 = (undefined1  [8])0x0;
                  auStack_1e0 = (undefined1  [8])0x0;
                  local_1d8._0_8_ = 0;
                  lVar10 = 10;
                  do {
                    local_208 = (undefined1  [8])local_1a0;
                    local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(local_160 + 8);
                    std::vector<std::thread,std::allocator<std::thread>>::
                    emplace_back<(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__0>
                              ((vector<std::thread,std::allocator<std::thread>> *)local_1e8,
                               (anon_class_16_2_e7b7d2c5_for__M_head_impl *)local_208);
                    local_208 = (undefined1  [8])local_1a0;
                    local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(local_160 + 8);
                    std::vector<std::thread,std::allocator<std::thread>>::
                    emplace_back<(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__1>
                              ((vector<std::thread,std::allocator<std::thread>> *)local_1e8,
                               (anon_class_16_2_e7b7d2c5_for__M_head_impl *)local_208);
                    local_208 = (undefined1  [8])local_1a0;
                    local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_160;
                    std::vector<std::thread,std::allocator<std::thread>>::
                    emplace_back<(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__2>
                              ((vector<std::thread,std::allocator<std::thread>> *)local_1e8,
                               (anon_class_16_2_e7b7d2c6_for__M_head_impl *)local_208);
                    local_208 = (undefined1  [8])local_1a0;
                    local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_160;
                    std::vector<std::thread,std::allocator<std::thread>>::
                    emplace_back<(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__3>
                              ((vector<std::thread,std::allocator<std::thread>> *)local_1e8,
                               (anon_class_16_2_e7b7d2c6_for__M_head_impl *)local_208);
                    local_208 = (undefined1  [8])local_1a0;
                    local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_1f8;
                    std::vector<std::thread,std::allocator<std::thread>>::
                    emplace_back<(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__4>
                              ((vector<std::thread,std::allocator<std::thread>> *)local_1e8,
                               (anon_class_16_2_c3e0be2d_for__M_head_impl *)local_208);
                    local_208 = (undefined1  [8])local_1a0;
                    local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_1f8;
                    std::vector<std::thread,std::allocator<std::thread>>::
                    emplace_back<(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__5>
                              ((vector<std::thread,std::allocator<std::thread>> *)local_1e8,
                               (anon_class_16_2_c3e0be2d_for__M_head_impl *)local_208);
                    local_208 = (undefined1  [8])local_1a0;
                    local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_1f0;
                    std::vector<std::thread,std::allocator<std::thread>>::
                    emplace_back<(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__6>
                              ((vector<std::thread,std::allocator<std::thread>> *)local_1e8,
                               (anon_class_16_2_c3e0be2e_for__M_head_impl *)local_208);
                    local_208 = (undefined1  [8])local_1a0;
                    local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_1f0;
                    std::vector<std::thread,std::allocator<std::thread>>::
                    emplace_back<(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__7>
                              ((vector<std::thread,std::allocator<std::thread>> *)local_1e8,
                               (anon_class_16_2_c3e0be2e_for__M_head_impl *)local_208);
                    auVar5 = auStack_1e0;
                    lVar10 = lVar10 + -1;
                    _Var9._M_head_impl =
                         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1e8;
                  } while (lVar10 != 0);
                  for (; (undefined1  [8])_Var9._M_head_impl != auVar5;
                      _Var9._M_head_impl = _Var9._M_head_impl + 8) {
                    std::thread::join();
                  }
                  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                            ((vector<std::thread,_std::allocator<std::thread>_> *)local_1e8);
                }
                std::unique_ptr<x509_store_st,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<x509_store_st,_bssl::internal::Deleter> *)local_170);
              }
              std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<x509_st,_bssl::internal::Deleter> *)local_1f0);
            }
            std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&local_1f8);
          }
          else {
            testing::Message::Message((Message *)&local_1f8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_1e8,(internal *)local_208,
                       (AssertionResult *)"add_root(old_ca1, kOldHash)","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_1f0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x20e7,(char *)local_1e8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_1f0,(Message *)&local_1f8);
LAB_00400a62:
            pdVar6 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_200;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1f0);
            if (local_1e8 != (undefined1  [8])local_1d8) {
              operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
            }
            if ((long *)CONCAT44(local_1f8._M_t.
                                 super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._4_4_,
                                 local_1f8._M_t.
                                 super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._0_4_) !=
                (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_1f8._M_t.
                                             super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                             .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl.
                                             _4_4_,local_1f8._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_x509_st_*,_false>.
                                                  _M_head_impl._0_4_) + 8))();
            }
            auVar5 = (undefined1  [8])local_200;
            if (local_200 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
LAB_00400aa4:
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()(pdVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)auVar5);
            }
          }
LAB_00400aa9:
          if (local_198.data_ != (AssertHelperData *)&local_188) {
            operator_delete(local_198.data_,(ulong)(local_188._M_p + 1));
          }
          if (local_1c0 != (undefined1  [8])&local_1b0) {
            operator_delete((void *)local_1c0,local_1b0._M_allocated_capacity + 1);
          }
        }
        std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<x509_st,_bssl::internal::Deleter> *)local_160);
      }
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)(local_160 + 8));
    }
LAB_004000a5:
    if (local_130._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120) {
      operator_delete(local_130._M_head_impl,(ulong)((long)&local_120[0]->permittedSubtrees + 1));
    }
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
  }
  else {
    testing::Message::Message((Message *)local_1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)&local_130,(AssertionResult *)"dir.Init()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x20b7,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)local_1c0 !=
        (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(size_type *)local_1c0 + 8))();
    }
    if (local_128 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_128,local_128);
    }
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  ::~_Rb_tree(&local_90);
  bssl::TemporaryDirectory::~TemporaryDirectory((TemporaryDirectory *)(local_e8 + 8));
LAB_00400101:
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)local_178);
  return;
}

Assistant:

TEST(X509Test, DirHashThreads) {
  if (bssl::SkipTempFileTests()) {
    GTEST_SKIP();
  }

  bssl::UniquePtr<EVP_PKEY> key = PrivateKeyFromPEM(kP256Key);
  ASSERT_TRUE(key);

  // Generate some roots and fill a directory with OpenSSL's directory hash
  // format. The hash depends only on the name, so we do not need to
  // pre-generate the certificates. Test both DER and PEM.
  TemporaryHashDir dir(X509_FILETYPE_PEM);
  ASSERT_TRUE(dir.Init());

  auto add_root = [&](const std::string &name, NameHash name_hash) -> bool {
    bssl::UniquePtr<X509> ca =
        MakeTestCert(name.c_str(), name.c_str(), key.get(), /*is_ca=*/true);
    return ca != nullptr &&  //
           X509_sign(ca.get(), key.get(), EVP_sha256()) &&
           dir.AddCert(ca.get(), name_hash);
  };

  auto issue_cert = [&](const std::string &issuer) -> bssl::UniquePtr<X509> {
    bssl::UniquePtr<X509> cert =
        MakeTestCert(issuer.c_str(), "Leaf", key.get(), /*is_ca=*/false);
    if (cert == nullptr || !X509_sign(cert.get(), key.get(), EVP_sha256())) {
      return nullptr;
    }
    return cert;
  };

  auto add_crl = [&](const std::string &name, int this_update_offset_day,
                     NameHash name_hash) -> bool {
    bssl::UniquePtr<X509_CRL> crl = MakeTestCRL(
        name.c_str(), this_update_offset_day, /*next_update_offset_day=*/1);
    return crl != nullptr &&
           X509_CRL_sign(crl.get(), key.get(), EVP_sha256()) &&
           dir.AddCRL(crl.get(), name_hash);
  };

  // These two CAs collide under |X509_NAME_hash|.
  std::string ca1 = "Test CA 1191514847";
  std::string ca2 = "Test CA 1570301806";
  ASSERT_TRUE(add_root(ca1, kNewHash));
  ASSERT_TRUE(add_root(ca2, kNewHash));
  ASSERT_TRUE(add_crl(ca1, -2, kNewHash));
  ASSERT_TRUE(add_crl(ca2, -1, kNewHash));
  ASSERT_TRUE(add_crl(ca2, -2, kNewHash));
  ASSERT_TRUE(add_crl(ca1, -1, kNewHash));
  // Verify the hashes collided.
  ASSERT_EQ(dir.num_cert_hashes(), 1u);
  ASSERT_EQ(dir.num_crl_hashes(), 1u);
  bssl::UniquePtr<X509> leaf1 = issue_cert(ca1);
  ASSERT_TRUE(leaf1);
  bssl::UniquePtr<X509> leaf2 = issue_cert(ca2);
  ASSERT_TRUE(leaf2);

  // These two CAs collide under |X509_NAME_hash_old|.
  std::string old_ca1 = "Test CA 1069881739";
  std::string old_ca2 = "Test CA 940754110";
  ASSERT_TRUE(add_root(old_ca1, kOldHash));
  ASSERT_TRUE(add_root(old_ca2, kOldHash));
  ASSERT_TRUE(add_crl(old_ca1, -2, kOldHash));
  ASSERT_TRUE(add_crl(old_ca2, -1, kOldHash));
  ASSERT_TRUE(add_crl(old_ca2, -2, kOldHash));
  ASSERT_TRUE(add_crl(old_ca1, -1, kOldHash));
  // Verify the hashes collided.
  ASSERT_EQ(dir.num_cert_hashes(), 2u);
  ASSERT_EQ(dir.num_crl_hashes(), 2u);
  bssl::UniquePtr<X509> old_leaf1 = issue_cert(old_ca1);
  ASSERT_TRUE(old_leaf1);
  bssl::UniquePtr<X509> old_leaf2 = issue_cert(old_ca2);
  ASSERT_TRUE(old_leaf2);

  // Make an |X509_STORE| that gets CAs from |dir|.
  bssl::UniquePtr<X509_STORE> store(X509_STORE_new());
  ASSERT_TRUE(store);
  ASSERT_TRUE(X509_STORE_load_locations(store.get(), /*file=*/nullptr,
                                        dir.path().c_str()));

  auto verify = [&](X509 *cert, bool crl_check) {
    bssl::UniquePtr<X509_STORE_CTX> ctx(X509_STORE_CTX_new());
    ASSERT_TRUE(ctx);
    ASSERT_TRUE(X509_STORE_CTX_init(ctx.get(), store.get(), cert,
                                    /*chain=*/nullptr));
    X509_STORE_CTX_set_flags(ctx.get(), crl_check ? X509_V_FLAG_CRL_CHECK : 0);
    X509_STORE_CTX_set_time_posix(ctx.get(), /*flags=*/0, kReferenceTime);
    EXPECT_TRUE(X509_verify_cert(ctx.get()))
        << X509_verify_cert_error_string(X509_STORE_CTX_get_error(ctx.get()));
  };

  const size_t kNumThreads = 10;
  std::vector<std::thread> threads;
  for (size_t i = 0; i < kNumThreads; i++) {
    threads.emplace_back([&] { verify(leaf1.get(), false); });
    threads.emplace_back([&] { verify(leaf1.get(), true); });
    threads.emplace_back([&] { verify(leaf2.get(), false); });
    threads.emplace_back([&] { verify(leaf2.get(), true); });

    threads.emplace_back([&] { verify(old_leaf1.get(), false); });
    threads.emplace_back([&] { verify(old_leaf1.get(), true); });
    threads.emplace_back([&] { verify(old_leaf2.get(), false); });
    threads.emplace_back([&] { verify(old_leaf2.get(), true); });
  }
  for (auto &thread : threads) {
    thread.join();
  }
}